

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O2

MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *
wasm::WATParser::anon_unknown_21::maybeAction
          (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
           *__return_storage_ptr__,Lexer *in)

{
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> *this;
  _Variant_storage<false,_wasm::Literal,_wasm::Err> *this_00;
  _Variant_storage<false,_wasm::Literal,_wasm::Err> *this_01;
  bool bVar1;
  _Variant_storage<false,_wasm::Literal,_wasm::Err> *x;
  SmallVector<wasm::Literal,_1UL> *other;
  string *this_02;
  string_view expected;
  string_view expected_00;
  undefined1 auStack_1f8 [8];
  optional<wasm::Name> name;
  undefined1 auStack_1c0 [8];
  optional<wasm::Name> id;
  string local_188;
  string local_168;
  string local_148;
  undefined1 auStack_128 [8];
  Result<wasm::Literals> args;
  Result<wasm::Literal> _val;
  Result<wasm::Literal> l;
  Literals lits;
  
  expected._M_str = "invoke";
  expected._M_len = 6;
  bVar1 = Lexer::takeSExprStart(in,expected);
  if (bVar1) {
    Lexer::takeID((optional<wasm::Name> *)auStack_1c0,in);
    Lexer::takeName((optional<wasm::Name> *)auStack_1f8,in);
    if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_index = '\0';
      l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
      super__Variant_storage_alias<wasm::Literal,_wasm::Err>._33_7_ = 0;
      lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      this_00 = (_Variant_storage<false,_wasm::Literal,_wasm::Err> *)
                ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20);
      this_01 = (_Variant_storage<false,_wasm::Literal,_wasm::Err> *)
                ((long)&args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                        super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38);
      do {
        bVar1 = Lexer::peekRParen(in);
        if (bVar1) {
          std::__detail::__variant::_Variant_storage<false,wasm::Literals,wasm::Err>::
          _Variant_storage<0ul,wasm::Literals>
                    ((_Variant_storage<false,wasm::Literals,wasm::Err> *)auStack_128,
                     (__index_type *)
                     ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
LAB_00c83292:
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)
                     ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                             super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Literals,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literals,_wasm::Err> *)
                          ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),
                          (_Copy_ctor_base<false,_wasm::Literals,_wasm::Err> *)auStack_128);
          if ((char)lits.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == '\x01') {
            std::__cxx11::string::string
                      ((string *)
                       ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),
                       (string *)
                       ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
            std::__detail::__variant::
            _Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
            ::_Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
                        *)__return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                               super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
            std::__detail::__variant::_Variant_storage<false,_wasm::Literals,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::Err> *)
                              ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Literals,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::Err> *)
                              ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
            bVar1 = Lexer::takeRParen(in);
            if (bVar1) {
              this = &lits.super_SmallVector<wasm::Literal,_1UL>.flexible;
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 =
                   (int64_t)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_payload._M_value.
                            super_IString.str._M_str;
              l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_ = auStack_1c0;
              lits.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
                   id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
              super_IString.str._M_str = (char *)auStack_1f8;
              lits.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
              other = (SmallVector<wasm::Literal,_1UL> *)0x0;
              if (args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                  super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Literals,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Literals,_wasm::Err>._M_u._M_first._M_storage.
                  _M_storage[0x30] == '\0') {
                other = (SmallVector<wasm::Literal,_1UL> *)auStack_128;
              }
              SmallVector<wasm::Literal,_1UL>::SmallVector
                        ((SmallVector<wasm::Literal,_1UL> *)this,other);
              std::__detail::__variant::
              _Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
              ::_Variant_storage<0ul,wasm::WATParser::InvokeAction>
                        ((_Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
                          *)__return_storage_ptr__,
                         (__index_type *)
                         ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
              SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)this)
              ;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_188,"expected end of invoke action",
                         (allocator<char> *)
                         ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
              Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
                         &local_188);
              std::__detail::__variant::
              _Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
              ::_Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
                          *)__return_storage_ptr__,
                         (__index_type *)
                         ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
              std::__cxx11::string::~string((string *)&local_188);
            }
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Literals,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::Err> *)auStack_128);
          return __return_storage_ptr__;
        }
        const_((Result<wasm::Literal> *)this_00,in);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Literal,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Literal,_wasm::Err> *)this_01,
                   (_Copy_ctor_base<false,_wasm::Literal,_wasm::Err> *)this_00);
        if (_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged,
                     (string *)
                     ((long)&args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                             super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38));
          std::__detail::__variant::_Variant_storage<false,wasm::Literals,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Literals,wasm::Err> *)auStack_128,
                     &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
          std::__cxx11::string::~string
                    ((string *)
                     &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
          std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)
                            ((long)&args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38));
          std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)
                            ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
          goto LAB_00c83292;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage(this_01);
        x = (_Variant_storage<false,_wasm::Literal,_wasm::Err> *)0x0;
        if (l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
          x = this_00;
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)
                   ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                           super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),(Literal *)x);
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage(this_00);
      } while( true );
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,"expected export name",
               (allocator<char> *)auStack_128);
    Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
               (string *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__detail::__variant::
    _Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
    ::_Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
                *)__return_storage_ptr__,
               (__index_type *)
               ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                       super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
    this_02 = (string *)
              &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_engaged;
  }
  else {
    expected_00._M_str = "get";
    expected_00._M_len = 3;
    bVar1 = Lexer::takeSExprStart(in,expected_00);
    if (!bVar1) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
       + 0x68) = '\x01';
      return __return_storage_ptr__;
    }
    Lexer::takeID((optional<wasm::Name> *)auStack_128,in);
    Lexer::takeName((optional<wasm::Name> *)
                    ((long)&_val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in);
    if (l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
        super__Move_assign_alias<wasm::Literal,_wasm::Err>.
        super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
        super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
        super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._M_first._M_storage._M_storage
        [8] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"expected export name",
                 (allocator<char> *)
                 ((long)&args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38));
      Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
                 &local_168);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
      this_02 = &local_168;
    }
    else {
      bVar1 = Lexer::takeRParen(in);
      if (bVar1) {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
             = auStack_128;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 8) = args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Literals,_wasm::Err>.
                super__Variant_storage_alias<wasm::Literals,_wasm::Err>._M_u._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x20) = l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                   super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x10) = args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                   super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Literals,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Literals,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x18) = _val.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                   super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Literal,_wasm::Err>._32_8_;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x60) = 1;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
         + 0x68) = '\0';
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"expected end of get action",
                 (allocator<char> *)
                 ((long)&args.val.super__Variant_base<wasm::Literals,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literals,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literals,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literals,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literals,_wasm::Err> + 0x38));
      Lexer::err((Err *)((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                                super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20),in,
                 &local_148);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&l.val.super__Variant_base<wasm::Literal,_wasm::Err>.
                         super__Move_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Literal,_wasm::Err> + 0x20));
      this_02 = &local_148;
    }
  }
  std::__cxx11::string::~string((string *)this_02);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<Action> maybeAction(Lexer& in) {
  if (in.takeSExprStart("invoke"sv)) {
    auto id = in.takeID();
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    auto args = consts(in);
    CHECK_ERR(args);
    if (!in.takeRParen()) {
      return in.err("expected end of invoke action");
    }
    return InvokeAction{id, *name, *args};
  }

  if (in.takeSExprStart("get"sv)) {
    auto id = in.takeID();
    auto name = in.takeName();
    if (!name) {
      return in.err("expected export name");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of get action");
    }
    return GetAction{id, *name};
  }

  return {};
}